

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O2

void sqlcheck::CheckRecursiveDependency
               (Configuration *state,string *sql_statement,bool *print_statement)

{
  string title;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  regex pattern;
  string table_name;
  string local_68;
  string local_48;
  
  GetTableName(&table_name,sql_statement);
  if (table_name._M_string_length != 0) {
    std::operator+(&local_c8,"(references\\s+",&table_name);
    std::operator+(&title,&local_c8,")");
    std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
    basic_regex<std::char_traits<char>,std::allocator<char>>
              ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&pattern,&title,0x10);
    std::__cxx11::string::~string((string *)&title);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string((string *)&title,"Recursive Dependency",(allocator *)&local_c8);
    std::__cxx11::string::string((string *)&local_48,(string *)&title);
    std::__cxx11::string::string((string *)&local_68,anon_var_dwarf_a948c,(allocator *)&local_c8);
    CheckPattern(state,sql_statement,print_statement,&pattern,RISK_LEVEL_HIGH,
                 PATTERN_TYPE_LOGICAL_DATABASE_DESIGN,&local_48,&local_68,true,0);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&title);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&pattern);
  }
  std::__cxx11::string::~string((string *)&table_name);
  return;
}

Assistant:

void CheckRecursiveDependency(Configuration& state,
                              const std::string& sql_statement,
                              bool& print_statement){

  std::string table_name = GetTableName(sql_statement);
  if(table_name.empty()){
    return;
  }

  std::regex pattern("(references\\s+" + table_name+ ")");
  std::string title = "Recursive Dependency";
  PatternType pattern_type = PatternType::PATTERN_TYPE_LOGICAL_DATABASE_DESIGN;

  auto message =
      "● Avoid recursive relationships:  "
      "It’s common for data to have recursive relationships. Data may be organized in a "
      "treelike or hierarchical way. However, creating a foreign key constraint to enforce "
      "the relationship between two columns in the same table lends to awkward querying. "
      "Each level of the tree corresponds to another join. You will need to issue recursive "
      "queries to get all descendants or all ancestors of a node. "
      "A solution is to construct an additional closure table. It involves storing all paths "
      "through the tree, not just those with a direct parent-child relationship. "
      "You might want to compare different hierarchical data designs -- closure table, "
      "path enumeration, nested sets -- and pick one based on your application's needs.";

  CheckPattern(state,
               sql_statement,
               print_statement,
               pattern,
               RISK_LEVEL_HIGH,
               pattern_type,
               title,
               message,
               true);

}